

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSeparateShaderObjsTests.cpp
# Opt level: O3

IterateResult __thiscall glcts::ProgramUniformCase::iterate(ProgramUniformCase *this)

{
  DataType dType;
  RenderContext *renderCtx;
  undefined8 uVar1;
  int iVar2;
  GLuint programA;
  GLuint programB;
  uint uVar3;
  undefined4 uVar4;
  undefined4 extraout_var;
  TestError *this_00;
  GLSLVersion extraout_EDX;
  GLSLVersion extraout_EDX_00;
  GLSLVersion extraout_EDX_01;
  GLSLVersion GVar6;
  GLSLVersion extraout_EDX_02;
  GLSLVersion extraout_EDX_03;
  long lVar7;
  string frag;
  string vtx;
  string fragNoMain;
  ShaderProgram progNoLink;
  vector<char,_std::allocator<char>_> shaderbuf;
  allocator<char> local_272;
  allocator<char> local_271;
  undefined1 *local_270;
  long local_268;
  undefined1 local_260;
  undefined7 uStack_25f;
  pointer local_250;
  undefined8 local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  long local_220 [2];
  value_type local_210;
  value_type local_1f0;
  undefined1 local_1d0 [152];
  deUint32 local_138;
  ProgramSources local_100;
  undefined8 *puVar5;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  puVar5 = (undefined8 *)CONCAT44(extraout_var,iVar2);
  iVar2 = 1000;
  lVar7 = 0;
  do {
    local_270 = (undefined1 *)((ulong)local_270 & 0xffffffff00000000);
    local_1d0._0_8_ = local_1d0 + 0x10;
    local_1d0._8_8_ = (pointer)0x0;
    local_1d0[0x10] = '\0';
    dType = *(DataType *)((long)&DAT_01ae8ec0 + lVar7);
    generateUniformFragSrc(this,(string *)local_1d0,this->m_glslVersion,dType);
    uVar1 = local_1d0._8_8_;
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)&local_100,local_1d0._8_8_ + 1,
               (allocator_type *)((long)&local_240 + 0x10));
    std::__cxx11::string::copy
              (local_1d0,
               (ulong)local_100.sources[0].
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,uVar1);
    *(undefined1 *)
     ((long)&((local_100.sources[0].
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + uVar1) = 0;
    local_250 = local_100.sources[0].
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    programA = (*(code *)puVar5[0x7f])(0x8b30,1,&local_250);
    programB = (*(code *)puVar5[0x7f])(0x8b30,1,&local_250);
    if (dType - TYPE_FLOAT_MAT2 < 9 || dType - TYPE_DOUBLE_MAT2 < 9) {
      setAndCompareMatrixUniforms(this,(GLuint)local_270,programA,programB,dType,iVar2);
      (*(code *)puVar5[0xdb])(1,&local_270);
      (*(code *)puVar5[0x13])((ulong)local_270 & 0xffffffff);
      (*(code *)puVar5[0x2d1])((ulong)local_270 & 0xffffffff,2,programA);
      setAndCompareMatrixUniforms(this,(GLuint)local_270,programA,programB,dType,iVar2 + 100);
      (*(code *)*puVar5)((ulong)local_270 & 0xffffffff,programB);
      setAndCompareMatrixUniforms(this,(GLuint)local_270,programA,programB,dType,iVar2 + 200);
    }
    else {
      setAndCompareUniforms(this,(GLuint)local_270,programA,programB,dType,iVar2);
      (*(code *)puVar5[0xdb])(1,&local_270);
      (*(code *)puVar5[0x13])((ulong)local_270 & 0xffffffff);
      (*(code *)puVar5[0x2d1])((ulong)local_270 & 0xffffffff,2,programA);
      setAndCompareUniforms(this,(GLuint)local_270,programA,programB,dType,iVar2 + 100);
      (*(code *)*puVar5)((ulong)local_270 & 0xffffffff,programB);
      setAndCompareUniforms(this,(GLuint)local_270,programA,programB,dType,iVar2 + 200);
    }
    (*(code *)puVar5[0x89])(programA);
    (*(code *)puVar5[0x89])(programB);
    (*(code *)puVar5[0x8a])(1,&local_270);
    GVar6 = extraout_EDX;
    if (local_100.sources[0].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_100.sources[0].
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_100.sources[0].
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_100.sources[0].
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      GVar6 = extraout_EDX_00;
    }
    if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
      operator_delete((void *)local_1d0._0_8_,CONCAT71(local_1d0._17_7_,local_1d0[0x10]) + 1);
      GVar6 = extraout_EDX_01;
    }
    iVar2 = iVar2 + 1000;
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x14);
  local_250 = &local_240;
  local_248 = 0;
  local_240._M_dataplus._M_p._0_1_ = 0;
  local_268 = 0;
  local_260 = 0;
  local_270 = &local_260;
  generateBasicVertexSrc_abi_cxx11_((string *)local_1d0,(glcts *)(ulong)this->m_glslVersion,GVar6);
  std::__cxx11::string::operator=((string *)&local_250,(string *)local_1d0);
  GVar6 = extraout_EDX_02;
  if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
    operator_delete((void *)local_1d0._0_8_,CONCAT71(local_1d0._17_7_,local_1d0[0x10]) + 1);
    GVar6 = extraout_EDX_03;
  }
  generateBasicFragmentSrc_abi_cxx11_((string *)local_1d0,(glcts *)(ulong)this->m_glslVersion,GVar6)
  ;
  std::__cxx11::string::operator=((string *)&local_270,(string *)local_1d0);
  if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
    operator_delete((void *)local_1d0._0_8_,CONCAT71(local_1d0._17_7_,local_1d0[0x10]) + 1);
  }
  local_240.field_2._M_allocated_capacity = (size_type)local_220;
  std::__cxx11::string::_M_construct<char*>
            ((string *)((long)&local_240 + 0x10),local_270,local_270 + local_268);
  uVar3 = std::__cxx11::string::find((char *)((long)&local_240 + 0x10),0x1ae6ae8,0);
  std::__cxx11::string::replace((long)&local_240 + 0x10,(ulong)uVar3,&DAT_00000004,0x1ae6aed);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0,(char *)local_250,&local_271);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,(char *)local_240.field_2._M_allocated_capacity,&local_272);
  memset(&local_100,0,0xac);
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_100._193_8_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_100.sources,&local_1f0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_100.sources + 1,&local_210);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_1d0,renderCtx,&local_100);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_100.transformFeedbackVaryings);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_100.attribLocationBindings);
  lVar7 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_100.sources[0].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar7));
    lVar7 = lVar7 + -0x18;
  } while (lVar7 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  (*(code *)puVar5[0x20b])(local_138,0x8258,1);
  (*(code *)puVar5[0x19d])(local_138);
  uVar4 = (*(code *)puVar5[0x169])(local_138,"u_color");
  (*(code *)puVar5[0x226])(0x3f800000,0x3f800000,0x3f800000,0x3f800000,local_138,uVar4);
  iVar2 = (*(code *)puVar5[0x100])();
  if (iVar2 == 0x502) {
    (*(code *)puVar5[0x89])(local_138);
    (*(code *)puVar5[0x226])(0x3f800000,0x3f800000,0x3f800000,0x3f800000,local_138);
    iVar2 = (*(code *)puVar5[0x100])();
    if (iVar2 == 0x501) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
      glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_1d0);
      if ((long *)local_240.field_2._M_allocated_capacity != local_220) {
        operator_delete((void *)local_240.field_2._M_allocated_capacity,local_220[0] + 1);
      }
      if (local_270 != &local_260) {
        operator_delete(local_270,CONCAT71(uStack_25f,local_260) + 1);
      }
      if (local_250 != &local_240) {
        operator_delete(local_250,
                        CONCAT71(local_240._M_dataplus._M_p._1_7_,local_240._M_dataplus._M_p._0_1_)
                        + 1);
      }
      return STOP;
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"ProgramUniformi failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,0x7b9);
  }
  else {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"ProgramUniformi failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,0x7b0);
  }
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

IterateResult iterate(void)
	{
		const glw::Functions& gl	   = m_context.getRenderContext().getFunctions();
		glu::DataType		  dType[5] = { glu::TYPE_INT, glu::TYPE_UINT, glu::TYPE_FLOAT, glu::TYPE_FLOAT_MAT2,
								   glu::TYPE_FLOAT_MAT2X3 };

		// Loop over the various data types, generate fragment programs, and test uniforms
		// (MAT2 means stands for all square matrices, MAT2x3 stands for all non-square matrices)
		for (int i = 0; i < 5; i++)
		{
			glw::GLuint programA, programB;
			glw::GLuint pipeline = 0;
			const char* shaderSrc[1];
			std::string fragSrc;
			int			seed = 1000 + (1000 * i);

			generateUniformFragSrc(fragSrc, m_glslVersion, dType[i]);

			size_t			  length = fragSrc.size();
			std::vector<char> shaderbuf(length + 1);
			fragSrc.copy(&shaderbuf[0], length);
			shaderbuf[length] = '\0';
			shaderSrc[0]	  = &shaderbuf[0];
			programA		  = gl.createShaderProgramv(GL_FRAGMENT_SHADER, 1, shaderSrc);
			programB		  = gl.createShaderProgramv(GL_FRAGMENT_SHADER, 1, shaderSrc);

			if (isDataTypeMatrix(dType[i]))
			{
				// programs are unbound
				setAndCompareMatrixUniforms(pipeline, programA, programB, dType[i], seed);

				// bind one program with useProgramStages
				gl.genProgramPipelines(1, &pipeline);
				gl.bindProgramPipeline(pipeline);
				gl.useProgramStages(pipeline, GL_FRAGMENT_SHADER_BIT, programA);
				seed += 100;
				setAndCompareMatrixUniforms(pipeline, programA, programB, dType[i], seed);

				// make an active program with activeShaderProgram
				gl.activeShaderProgram(pipeline, programB);
				seed += 100;
				setAndCompareMatrixUniforms(pipeline, programA, programB, dType[i], seed);
			}
			else
			{
				// programs are unbound
				setAndCompareUniforms(pipeline, programA, programB, dType[i], seed);

				// bind one program with useProgramStages
				gl.genProgramPipelines(1, &pipeline);
				gl.bindProgramPipeline(pipeline);
				gl.useProgramStages(pipeline, GL_FRAGMENT_SHADER_BIT, programA);
				seed += 100;
				setAndCompareUniforms(pipeline, programA, programB, dType[i], seed);

				// make an active program with activeShaderProgram
				gl.activeShaderProgram(pipeline, programB);
				seed += 100;
				setAndCompareUniforms(pipeline, programA, programB, dType[i], seed);
			}

			gl.deleteProgram(programA);
			gl.deleteProgram(programB);
			gl.deleteProgramPipelines(1, &pipeline);
		}

		// Negative Cases

		// Program that is not successfully linked
		glw::GLenum err;
		std::string vtx;
		std::string frag;

		vtx  = generateBasicVertexSrc(m_glslVersion);
		frag = generateBasicFragmentSrc(m_glslVersion);

		// remove the main keyword so it doesn't link
		std::string  fragNoMain = frag;
		unsigned int pos		= (unsigned int)fragNoMain.find("main");
		fragNoMain.replace(pos, 4, "niaM");
		glu::ShaderProgram progNoLink(m_context.getRenderContext(),
									  glu::makeVtxFragSources(vtx.c_str(), fragNoMain.c_str()));
		gl.programParameteri(progNoLink.getProgram(), GL_PROGRAM_SEPARABLE, GL_TRUE);
		gl.linkProgram(progNoLink.getProgram());
		int unifLocation = gl.getUniformLocation(progNoLink.getProgram(), "u_color");
		gl.programUniform4f(progNoLink.getProgram(), unifLocation, 1.0, 1.0, 1.0, 1.0);
		err = gl.getError();
		if (err != GL_INVALID_OPERATION)
		{
			TCU_FAIL("ProgramUniformi failed");
		}

		// deleted program
		gl.deleteProgram(progNoLink.getProgram());
		gl.programUniform4f(progNoLink.getProgram(), unifLocation, 1.0, 1.0, 1.0, 1.0);
		err = gl.getError();
		if (err != GL_INVALID_VALUE)
		{
			TCU_FAIL("ProgramUniformi failed");
		}

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}